

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O2

void __thiscall
iDynTree::optimalcontrol::anon_struct_816_18_fcbdc1fc::resizeBuffers<unsigned_long>
          (anon_struct_816_18_fcbdc1fc *this,unsigned_long stateDim,unsigned_long controlDim)

{
  uint uVar1;
  
  uVar1 = ConstraintsGroup::constraintsDimension
                    ((this->group_ptr).
                     super___shared_ptr<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
  iDynTree::MatrixDynSize::resize((ulong)&this->stateJacobianBuffer,(ulong)uVar1);
  uVar1 = ConstraintsGroup::constraintsDimension
                    ((this->group_ptr).
                     super___shared_ptr<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
  iDynTree::MatrixDynSize::resize((ulong)&this->controlJacobianBuffer,(ulong)uVar1);
  iDynTree::MatrixDynSize::resize((ulong)&this->stateHessianBuffer,stateDim & 0xffffffff);
  iDynTree::MatrixDynSize::zero();
  iDynTree::MatrixDynSize::resize((ulong)&this->controlHessianBuffer,controlDim & 0xffffffff);
  iDynTree::MatrixDynSize::zero();
  iDynTree::MatrixDynSize::resize((ulong)&this->mixedHessianBuffer,stateDim & 0xffffffff);
  iDynTree::MatrixDynSize::zero();
  return;
}

Assistant:

void resizeBuffers(intType stateDim, intType controlDim) {
                unsigned int nx = static_cast<unsigned int>(stateDim);
                unsigned int nu = static_cast<unsigned int>(controlDim);
                stateJacobianBuffer.resize(group_ptr->constraintsDimension(), nx);
                controlJacobianBuffer.resize(group_ptr->constraintsDimension(), nu);
                stateHessianBuffer.resize(nx, nx);
                stateHessianBuffer.zero();
                controlHessianBuffer.resize(nu, nu);
                controlHessianBuffer.zero();
                mixedHessianBuffer.resize(nx, nu);
                mixedHessianBuffer.zero();
            }